

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

MakeNet * __thiscall
notch::core::MakeNet::addFC(MakeNet *this,Array *weights,Array *bias,Activation *af)

{
  ulong uVar1;
  iterator __position;
  logic_error *this_00;
  MakeLayer mk;
  LayerType local_6c;
  MakeLayer local_68;
  
  uVar1 = bias->_M_size;
  if (weights->_M_size / uVar1 == this->nOutputs) {
    checkConfig(this);
    MakeLayer::MakeLayer(&local_68,weights,bias,af);
    std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
              (&this->layerMakers,&local_68);
    local_6c = FC;
    __position._M_current =
         (this->layerTypes).
         super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->layerTypes).
        super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
      ::_M_realloc_insert<notch::core::MakeNet::LayerType>(&this->layerTypes,__position,&local_6c);
    }
    else {
      *__position._M_current = FC;
      (this->layerTypes).
      super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->nOutputs = uVar1;
    if (local_68.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.maybeBias.
                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.maybeWeights.
                 super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return this;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10,weights,weights->_M_size % uVar1);
  ::std::logic_error::logic_error(this_00,"cannot add a layer with an incompatible weight matrix");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

MakeNet &addFC(const Array &weights, const Array &bias,
                   const Activation &af = scaledTanh) {
        size_t w_rows = bias.size();
        size_t w_cols = weights.size() / w_rows;
        if (w_cols != nOutputs) {
            throw std::logic_error("cannot add a layer with an incompatible weight matrix");
        }
        checkConfig();
        MakeLayer mk(weights, bias, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        nOutputs = w_rows;
        return *this;
    }